

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

ptr __thiscall ThreadPool::threadfun(ThreadPool *this,ptr *arg)

{
  ThreadPool *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr pVar1;
  SP_Appender appender;
  queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
  appenders;
  __shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2> local_78;
  queue<std::shared_ptr<Appender>,_std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>_>
  local_68;
  
  std::__shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2> *)this,
             &arg->super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>);
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while (this_00 = (this->super_enable_shared_from_this<ThreadPool>)._M_weak_this.
                   super___weak_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        this_00->m_isRunning == true) {
    take(&local_68,this_00);
    while (local_68.c.
           super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_68.c.
           super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::__shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_78,
                 &(local_68.c.
                   super__Deque_base<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>);
      std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>::pop_front
                (&local_68.c);
      (**(local_78._M_ptr)->_vptr_Appender)();
    }
    std::deque<std::shared_ptr<Appender>,_std::allocator<std::shared_ptr<Appender>_>_>::~deque
              (&local_68.c);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  pVar1.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr)pVar1.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ThreadPool::ptr ThreadPool::threadfun(ThreadPool::ptr arg)
{
	ThreadPool::ptr pool = static_cast<ThreadPool::ptr>(arg);
	SP_Appender appender=nullptr;
	while (pool->m_isRunning) {
		std::queue<SP_Appender> appenders= pool->take();
		while(!appenders.empty()) {
			appender=appenders.front();
			appenders.pop();
			appender->append();
		}
	}
	return pool;
}